

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::SubdivPatch1IntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  vfloat<4> vVar3;
  uint uVar4;
  BVH *bvh;
  size_t sVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [12];
  undefined8 uVar20;
  undefined8 uVar21;
  GridSOA *pGVar22;
  size_t sVar23;
  bool bVar24;
  uint uVar25;
  undefined4 uVar26;
  int iVar27;
  size_t sVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  NodeRef *pNVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar37;
  NodeRef root;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  float fVar167;
  float fVar168;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar169;
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar182;
  undefined1 auVar178 [16];
  float fVar180;
  float fVar181;
  undefined1 auVar179 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [64];
  undefined1 auVar188 [16];
  undefined1 auVar189 [64];
  float fVar190;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar191 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  RTCFilterFunctionNArguments args;
  float local_1b28;
  float fStack_1b24;
  float fStack_1b20;
  undefined1 local_1af8 [16];
  RayK<4> *local_1ae8;
  GridSOA *local_1ae0;
  GridSOA *local_1ad8;
  GridSOA *local_1ad0;
  GridSOA *local_1ac8;
  GridSOA *local_1ac0;
  vbool<4> terminated;
  GridSOA *local_1a98;
  GridSOA *local_1a90;
  Precalculations pre;
  undefined1 local_1a68 [8];
  float fStack_1a60;
  float fStack_1a5c;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_19c8;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined1 local_1988 [16];
  undefined1 local_1978 [16];
  undefined1 local_1968 [16];
  uint local_1958;
  uint uStack_1954;
  uint uStack_1950;
  uint uStack_194c;
  uint uStack_1948;
  uint uStack_1944;
  uint uStack_1940;
  uint uStack_193c;
  undefined1 local_1938 [16];
  TravRayK<4,_true> tray;
  undefined1 local_1828 [16];
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [8];
  float fStack_17d0;
  float fStack_17cc;
  undefined1 local_17c8 [8];
  float fStack_17c0;
  float fStack_17bc;
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [8];
  float fStack_1760;
  float fStack_175c;
  undefined1 local_1758 [8];
  float fStack_1750;
  float fStack_174c;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar21 = mm_lookupmask_ps._8_8_;
  uVar20 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar80 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar55 = vpcmpeqd_avx(auVar80,(undefined1  [16])valid_i->field_0);
    auVar56 = ZEXT816(0) << 0x40;
    auVar12 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar56,5);
    auVar115 = auVar55 & auVar12;
    if ((((auVar115 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar115 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar115 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar115[0xf] < '\0'
       ) {
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      auVar12 = vandps_avx(auVar12,auVar55);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      local_1938._8_4_ = 0x7fffffff;
      local_1938._0_8_ = 0x7fffffff7fffffff;
      local_1938._12_4_ = 0x7fffffff;
      auVar55 = vandps_avx(local_1938,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar170._8_4_ = 0x219392ef;
      auVar170._0_8_ = 0x219392ef219392ef;
      auVar170._12_4_ = 0x219392ef;
      auVar115 = vcmpps_avx(auVar55,auVar170,1);
      auVar184._8_4_ = 0x3f800000;
      auVar184._0_8_ = 0x3f8000003f800000;
      auVar184._12_4_ = 0x3f800000;
      auVar66 = vdivps_avx(auVar184,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar55 = vandps_avx(local_1938,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar131 = vcmpps_avx(auVar55,auVar170,1);
      auVar146 = vdivps_avx(auVar184,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar55 = vandps_avx(local_1938,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar55 = vcmpps_avx(auVar55,auVar170,1);
      auVar147 = vdivps_avx(auVar184,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar171._8_4_ = 0x5d5e0b6b;
      auVar171._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar171._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar66,auVar171,auVar115)
      ;
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar146,auVar171,auVar131);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar147,auVar171,auVar55)
      ;
      auVar55 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar56,1);
      auVar66._8_4_ = 0x10;
      auVar66._0_8_ = 0x1000000010;
      auVar66._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar55,auVar66);
      auVar55 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar56,5);
      auVar115._8_4_ = 0x20;
      auVar115._0_8_ = 0x2000000020;
      auVar115._12_4_ = 0x20;
      auVar146._8_4_ = 0x30;
      auVar146._0_8_ = 0x3000000030;
      auVar146._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar146,auVar115,auVar55);
      auVar55 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar56,5);
      auVar131._8_4_ = 0x40;
      auVar131._0_8_ = 0x4000000040;
      auVar131._12_4_ = 0x40;
      auVar147._8_4_ = 0x50;
      auVar147._0_8_ = 0x5000000050;
      auVar147._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar147,auVar131,auVar55);
      auVar55 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar56);
      auVar115 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar56);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar187 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar55,auVar12);
      auVar90 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar55._8_4_ = 0xff800000;
      auVar55._0_8_ = 0xff800000ff800000;
      auVar55._12_4_ = 0xff800000;
      auVar117 = ZEXT1664(auVar55);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar55,auVar115,auVar12);
      terminated.field_0.i[1] = auVar12._4_4_ ^ auVar80._4_4_;
      terminated.field_0.i[0] = auVar12._0_4_ ^ auVar80._0_4_;
      terminated.field_0.i[2] = auVar12._8_4_ ^ auVar80._8_4_;
      terminated.field_0.i[3] = auVar12._12_4_ ^ auVar80._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar35 = 3;
      }
      else {
        uVar35 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1ae8 = ray + 0x80;
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar37 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar189 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_01557836:
      do {
        do {
          root.ptr = pNVar33[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0155908e;
          pNVar33 = pNVar33 + -1;
          paVar37 = paVar37 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar37->v;
          auVar197 = ZEXT1664((undefined1  [16])vVar3.field_0);
          auVar80 = vcmpps_avx((undefined1  [16])vVar3.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar25 = vmovmskps_avx(auVar80);
        } while (uVar25 == 0);
        uVar36 = (ulong)(uVar25 & 0xff);
        uVar25 = POPCOUNT(uVar25 & 0xff);
        if (uVar35 < uVar25) {
LAB_01557876:
          do {
            pGVar22 = pre.super_Precalculations.grid;
            sVar28 = 8;
            iVar27 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0155908e;
              auVar80 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar197._0_16_,6);
              if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar80[0xf] < '\0') {
                auVar80 = auVar117._0_16_;
                if (((uint)root.ptr & 0xf) == 8) {
                  auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                  auVar117 = ZEXT1664(auVar80);
                  auVar90 = ZEXT1664(auVar80 ^ (undefined1  [16])terminated.field_0);
                  uVar32 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
                  uVar30 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0xc);
                  uVar36 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24);
                  iVar27 = *(int *)(pre.super_Precalculations.grid + 0x10);
                  lVar34 = uVar32 * 0xc + uVar36;
                  lVar1 = uVar30 * 4;
                  uVar38 = root.ptr >> 4;
                  local_1ad8 = pre.super_Precalculations.grid +
                               uVar38 * 4 + lVar34 + uVar30 * 4 + 0x2c;
                  lVar29 = uVar36 + uVar32 * 8;
                  local_1ac0 = pre.super_Precalculations.grid +
                               uVar38 * 4 + lVar29 + uVar30 * 4 + 0x30;
                  lVar31 = uVar36 + uVar32 * 4;
                  local_1ac8 = pre.super_Precalculations.grid +
                               uVar38 * 4 + lVar31 + uVar30 * 4 + 0x30;
                  local_1ad0 = pre.super_Precalculations.grid +
                               uVar38 * 4 + uVar36 + uVar30 * 4 + 0x30;
                  local_1ae0 = pre.super_Precalculations.grid + uVar38 * 4 + lVar34 + 0x30;
                  local_1a90 = pre.super_Precalculations.grid + uVar38 * 4 + lVar29 + 0x30;
                  local_1a98 = pre.super_Precalculations.grid + uVar38 * 4 + lVar31 + 0x30;
                  lVar29 = uVar36 + uVar38 * 4 + 0x2c;
                  lVar31 = 0;
                  while (lVar31 != (ulong)(iVar27 != 2) + 1) {
                    lVar31 = lVar31 + 1;
                    lVar34 = 0;
                    do {
                      if ((ulong)(uVar30 != 2) * 4 + 4 == lVar34) break;
                      uVar26 = *(undefined4 *)(pGVar22 + lVar34 + lVar29);
                      auVar46._4_4_ = uVar26;
                      auVar46._0_4_ = uVar26;
                      auVar46._8_4_ = uVar26;
                      auVar46._12_4_ = uVar26;
                      auVar66 = auVar90._0_16_;
                      uVar26 = *(undefined4 *)(local_1a98 + lVar34 + -4);
                      auVar67._4_4_ = uVar26;
                      auVar67._0_4_ = uVar26;
                      auVar67._8_4_ = uVar26;
                      auVar67._12_4_ = uVar26;
                      uVar26 = *(undefined4 *)(local_1a90 + lVar34 + -4);
                      auVar92._4_4_ = uVar26;
                      auVar92._0_4_ = uVar26;
                      auVar92._8_4_ = uVar26;
                      auVar92._12_4_ = uVar26;
                      uVar26 = *(undefined4 *)(local_1ad0 + lVar34 + -4);
                      auVar176._4_4_ = uVar26;
                      auVar176._0_4_ = uVar26;
                      auVar176._8_4_ = uVar26;
                      auVar176._12_4_ = uVar26;
                      uVar26 = *(undefined4 *)(local_1ac8 + lVar34 + -4);
                      auVar108._4_4_ = uVar26;
                      auVar108._0_4_ = uVar26;
                      auVar108._8_4_ = uVar26;
                      auVar108._12_4_ = uVar26;
                      uVar26 = *(undefined4 *)(local_1ac0 + lVar34 + -4);
                      auVar133._4_4_ = uVar26;
                      auVar133._0_4_ = uVar26;
                      auVar133._8_4_ = uVar26;
                      auVar133._12_4_ = uVar26;
                      auVar80 = *(undefined1 (*) [16])ray;
                      auVar55 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar115 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar146 = vsubps_avx(auVar46,auVar80);
                      auVar147 = vsubps_avx(auVar67,auVar55);
                      auVar170 = vsubps_avx(auVar92,auVar115);
                      auVar171 = vsubps_avx(auVar108,auVar55);
                      auVar184 = vsubps_avx(auVar133,auVar115);
                      auVar17 = vsubps_avx(auVar171,auVar147);
                      auVar18 = vsubps_avx(auVar184,auVar170);
                      auVar109._0_4_ = auVar171._0_4_ + auVar147._0_4_;
                      auVar109._4_4_ = auVar171._4_4_ + auVar147._4_4_;
                      auVar109._8_4_ = auVar171._8_4_ + auVar147._8_4_;
                      auVar109._12_4_ = auVar171._12_4_ + auVar147._12_4_;
                      fVar8 = auVar170._0_4_;
                      auVar160._0_4_ = auVar184._0_4_ + fVar8;
                      fVar9 = auVar170._4_4_;
                      auVar160._4_4_ = auVar184._4_4_ + fVar9;
                      fVar10 = auVar170._8_4_;
                      auVar160._8_4_ = auVar184._8_4_ + fVar10;
                      fVar11 = auVar170._12_4_;
                      auVar160._12_4_ = auVar184._12_4_ + fVar11;
                      auVar188._0_4_ = auVar109._0_4_ * auVar18._0_4_;
                      auVar188._4_4_ = auVar109._4_4_ * auVar18._4_4_;
                      auVar188._8_4_ = auVar109._8_4_ * auVar18._8_4_;
                      auVar188._12_4_ = auVar109._12_4_ * auVar18._12_4_;
                      auVar42 = vfmsub231ps_fma(auVar188,auVar17,auVar160);
                      auVar39 = vsubps_avx(auVar176,auVar80);
                      auVar40 = vsubps_avx(auVar39,auVar146);
                      auVar177._0_4_ = auVar160._0_4_ * auVar40._0_4_;
                      auVar177._4_4_ = auVar160._4_4_ * auVar40._4_4_;
                      auVar177._8_4_ = auVar160._8_4_ * auVar40._8_4_;
                      auVar177._12_4_ = auVar160._12_4_ * auVar40._12_4_;
                      auVar161._0_4_ = auVar39._0_4_ + auVar146._0_4_;
                      auVar161._4_4_ = auVar39._4_4_ + auVar146._4_4_;
                      auVar161._8_4_ = auVar39._8_4_ + auVar146._8_4_;
                      auVar161._12_4_ = auVar39._12_4_ + auVar146._12_4_;
                      auVar131 = vfmsub231ps_fma(auVar177,auVar18,auVar161);
                      auVar162._0_4_ = auVar161._0_4_ * auVar17._0_4_;
                      auVar162._4_4_ = auVar161._4_4_ * auVar17._4_4_;
                      auVar162._8_4_ = auVar161._8_4_ * auVar17._8_4_;
                      auVar162._12_4_ = auVar161._12_4_ * auVar17._12_4_;
                      auVar56 = vfmsub231ps_fma(auVar162,auVar40,auVar109);
                      fVar159 = *(float *)(ray + 0x60);
                      fVar167 = *(float *)(ray + 100);
                      fVar168 = *(float *)(ray + 0x68);
                      auVar19 = *(undefined1 (*) [12])(ray + 0x60);
                      fVar169 = *(float *)(ray + 0x6c);
                      auVar110._0_4_ = auVar56._0_4_ * fVar159;
                      auVar110._4_4_ = auVar56._4_4_ * fVar167;
                      auVar110._8_4_ = auVar56._8_4_ * fVar168;
                      auVar110._12_4_ = auVar56._12_4_ * fVar169;
                      auVar56 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar41 = vfmadd231ps_fma(auVar110,auVar56,auVar131);
                      auVar131 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar44 = vfmadd231ps_fma(auVar41,auVar131,auVar42);
                      uVar26 = *(undefined4 *)(pGVar22 + lVar34 + lVar29 + 4);
                      auVar47._4_4_ = uVar26;
                      auVar47._0_4_ = uVar26;
                      auVar47._8_4_ = uVar26;
                      auVar47._12_4_ = uVar26;
                      auVar80 = vsubps_avx(auVar47,auVar80);
                      uVar26 = *(undefined4 *)(local_1a98 + lVar34);
                      auVar68._4_4_ = uVar26;
                      auVar68._0_4_ = uVar26;
                      auVar68._8_4_ = uVar26;
                      auVar68._12_4_ = uVar26;
                      auVar55 = vsubps_avx(auVar68,auVar55);
                      uVar26 = *(undefined4 *)(local_1a90 + lVar34);
                      auVar118._4_4_ = uVar26;
                      auVar118._0_4_ = uVar26;
                      auVar118._8_4_ = uVar26;
                      auVar118._12_4_ = uVar26;
                      auVar115 = vsubps_avx(auVar118,auVar115);
                      auVar41 = vsubps_avx(auVar147,auVar55);
                      auVar170 = vsubps_avx(auVar170,auVar115);
                      auVar155._0_4_ = auVar147._0_4_ + auVar55._0_4_;
                      auVar155._4_4_ = auVar147._4_4_ + auVar55._4_4_;
                      auVar155._8_4_ = auVar147._8_4_ + auVar55._8_4_;
                      auVar155._12_4_ = auVar147._12_4_ + auVar55._12_4_;
                      auVar185._0_4_ = fVar8 + auVar115._0_4_;
                      auVar185._4_4_ = fVar9 + auVar115._4_4_;
                      auVar185._8_4_ = fVar10 + auVar115._8_4_;
                      auVar185._12_4_ = fVar11 + auVar115._12_4_;
                      fVar190 = auVar170._0_4_;
                      auVar134._0_4_ = fVar190 * auVar155._0_4_;
                      fVar192 = auVar170._4_4_;
                      auVar134._4_4_ = fVar192 * auVar155._4_4_;
                      fVar193 = auVar170._8_4_;
                      auVar134._8_4_ = fVar193 * auVar155._8_4_;
                      fVar194 = auVar170._12_4_;
                      auVar134._12_4_ = fVar194 * auVar155._12_4_;
                      auVar45 = vfmsub231ps_fma(auVar134,auVar41,auVar185);
                      auVar42 = vsubps_avx(auVar146,auVar80);
                      fVar13 = auVar42._0_4_;
                      auVar186._0_4_ = auVar185._0_4_ * fVar13;
                      fVar14 = auVar42._4_4_;
                      auVar186._4_4_ = auVar185._4_4_ * fVar14;
                      fVar15 = auVar42._8_4_;
                      auVar186._8_4_ = auVar185._8_4_ * fVar15;
                      fVar16 = auVar42._12_4_;
                      auVar186._12_4_ = auVar185._12_4_ * fVar16;
                      auVar148._0_4_ = auVar146._0_4_ + auVar80._0_4_;
                      auVar148._4_4_ = auVar146._4_4_ + auVar80._4_4_;
                      auVar148._8_4_ = auVar146._8_4_ + auVar80._8_4_;
                      auVar148._12_4_ = auVar146._12_4_ + auVar80._12_4_;
                      auVar43 = vfmsub231ps_fma(auVar186,auVar170,auVar148);
                      fVar175 = auVar41._0_4_;
                      auVar149._0_4_ = fVar175 * auVar148._0_4_;
                      fVar180 = auVar41._4_4_;
                      auVar149._4_4_ = fVar180 * auVar148._4_4_;
                      fVar181 = auVar41._8_4_;
                      auVar149._8_4_ = fVar181 * auVar148._8_4_;
                      fVar182 = auVar41._12_4_;
                      auVar149._12_4_ = fVar182 * auVar148._12_4_;
                      auVar64 = vfmsub231ps_fma(auVar149,auVar42,auVar155);
                      auVar156._0_4_ = fVar159 * auVar64._0_4_;
                      auVar156._4_4_ = fVar167 * auVar64._4_4_;
                      auVar156._8_4_ = fVar168 * auVar64._8_4_;
                      auVar156._12_4_ = fVar169 * auVar64._12_4_;
                      auVar43 = vfmadd231ps_fma(auVar156,auVar56,auVar43);
                      auVar45 = vfmadd231ps_fma(auVar43,auVar131,auVar45);
                      auVar43 = vsubps_avx(auVar80,auVar39);
                      auVar48._0_4_ = auVar39._0_4_ + auVar80._0_4_;
                      auVar48._4_4_ = auVar39._4_4_ + auVar80._4_4_;
                      auVar48._8_4_ = auVar39._8_4_ + auVar80._8_4_;
                      auVar48._12_4_ = auVar39._12_4_ + auVar80._12_4_;
                      auVar39 = vsubps_avx(auVar55,auVar171);
                      auVar69._0_4_ = auVar171._0_4_ + auVar55._0_4_;
                      auVar69._4_4_ = auVar171._4_4_ + auVar55._4_4_;
                      auVar69._8_4_ = auVar171._8_4_ + auVar55._8_4_;
                      auVar69._12_4_ = auVar171._12_4_ + auVar55._12_4_;
                      auVar171 = vsubps_avx(auVar115,auVar184);
                      auVar93._0_4_ = auVar115._0_4_ + auVar184._0_4_;
                      auVar93._4_4_ = auVar115._4_4_ + auVar184._4_4_;
                      auVar93._8_4_ = auVar115._8_4_ + auVar184._8_4_;
                      auVar93._12_4_ = auVar115._12_4_ + auVar184._12_4_;
                      auVar119._0_4_ = auVar171._0_4_ * auVar69._0_4_;
                      auVar119._4_4_ = auVar171._4_4_ * auVar69._4_4_;
                      auVar119._8_4_ = auVar171._8_4_ * auVar69._8_4_;
                      auVar119._12_4_ = auVar171._12_4_ * auVar69._12_4_;
                      auVar55 = vfmsub231ps_fma(auVar119,auVar39,auVar93);
                      auVar94._0_4_ = auVar43._0_4_ * auVar93._0_4_;
                      auVar94._4_4_ = auVar43._4_4_ * auVar93._4_4_;
                      auVar94._8_4_ = auVar43._8_4_ * auVar93._8_4_;
                      auVar94._12_4_ = auVar43._12_4_ * auVar93._12_4_;
                      auVar80 = vfmsub231ps_fma(auVar94,auVar171,auVar48);
                      auVar49._0_4_ = auVar39._0_4_ * auVar48._0_4_;
                      auVar49._4_4_ = auVar39._4_4_ * auVar48._4_4_;
                      auVar49._8_4_ = auVar39._8_4_ * auVar48._8_4_;
                      auVar49._12_4_ = auVar39._12_4_ * auVar48._12_4_;
                      auVar115 = vfmsub231ps_fma(auVar49,auVar43,auVar69);
                      auVar50._0_4_ = fVar159 * auVar115._0_4_;
                      auVar50._4_4_ = fVar167 * auVar115._4_4_;
                      auVar50._8_4_ = fVar168 * auVar115._8_4_;
                      auVar50._12_4_ = fVar169 * auVar115._12_4_;
                      auVar80 = vfmadd231ps_fma(auVar50,auVar56,auVar80);
                      auVar115 = vfmadd231ps_fma(auVar80,auVar131,auVar55);
                      auVar150._0_4_ = auVar115._0_4_ + auVar44._0_4_ + auVar45._0_4_;
                      auVar150._4_4_ = auVar115._4_4_ + auVar44._4_4_ + auVar45._4_4_;
                      auVar150._8_4_ = auVar115._8_4_ + auVar44._8_4_ + auVar45._8_4_;
                      auVar150._12_4_ = auVar115._12_4_ + auVar44._12_4_ + auVar45._12_4_;
                      auVar80 = vandps_avx(auVar150,local_1938);
                      auVar70._0_8_ =
                           CONCAT44(auVar80._4_4_ * 1.1920929e-07,auVar80._0_4_ * 1.1920929e-07);
                      auVar70._8_4_ = auVar80._8_4_ * 1.1920929e-07;
                      auVar70._12_4_ = auVar80._12_4_ * 1.1920929e-07;
                      auVar80 = vminps_avx(auVar44,auVar45);
                      auVar80 = vminps_avx(auVar80,auVar115);
                      auVar120._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
                      auVar120._8_4_ = -auVar70._8_4_;
                      auVar120._12_4_ = -auVar70._12_4_;
                      auVar80 = vcmpps_avx(auVar80,auVar120,5);
                      auVar55 = vmaxps_avx(auVar44,auVar45);
                      auVar55 = vmaxps_avx(auVar55,auVar115);
                      auVar55 = vcmpps_avx(auVar55,auVar70,2);
                      auVar80 = vorps_avx(auVar80,auVar55);
                      auVar55 = auVar66 & auVar80;
                      auVar80 = vandps_avx(auVar80,auVar66);
                      auVar115 = auVar44;
                      if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar55[0xf] < '\0') {
                        auVar51._0_4_ = fVar175 * auVar18._0_4_;
                        auVar51._4_4_ = fVar180 * auVar18._4_4_;
                        auVar51._8_4_ = fVar181 * auVar18._8_4_;
                        auVar51._12_4_ = fVar182 * auVar18._12_4_;
                        auVar71._0_4_ = fVar13 * auVar17._0_4_;
                        auVar71._4_4_ = fVar14 * auVar17._4_4_;
                        auVar71._8_4_ = fVar15 * auVar17._8_4_;
                        auVar71._12_4_ = fVar16 * auVar17._12_4_;
                        auVar184 = vfmsub213ps_fma(auVar17,auVar170,auVar51);
                        auVar95._0_4_ = auVar39._0_4_ * fVar190;
                        auVar95._4_4_ = auVar39._4_4_ * fVar192;
                        auVar95._8_4_ = auVar39._8_4_ * fVar193;
                        auVar95._12_4_ = auVar39._12_4_ * fVar194;
                        auVar121._0_4_ = fVar13 * auVar171._0_4_;
                        auVar121._4_4_ = fVar14 * auVar171._4_4_;
                        auVar121._8_4_ = fVar15 * auVar171._8_4_;
                        auVar121._12_4_ = fVar16 * auVar171._12_4_;
                        auVar17 = vfmsub213ps_fma(auVar171,auVar41,auVar95);
                        auVar55 = vandps_avx(auVar51,local_1938);
                        auVar171 = vandps_avx(auVar95,local_1938);
                        auVar55 = vcmpps_avx(auVar55,auVar171,1);
                        auVar171 = vblendvps_avx(auVar17,auVar184,auVar55);
                        auVar52._0_4_ = auVar43._0_4_ * fVar175;
                        auVar52._4_4_ = auVar43._4_4_ * fVar180;
                        auVar52._8_4_ = auVar43._8_4_ * fVar181;
                        auVar52._12_4_ = auVar43._12_4_ * fVar182;
                        auVar184 = vfmsub213ps_fma(auVar43,auVar170,auVar121);
                        auVar135._0_4_ = auVar40._0_4_ * fVar190;
                        auVar135._4_4_ = auVar40._4_4_ * fVar192;
                        auVar135._8_4_ = auVar40._8_4_ * fVar193;
                        auVar135._12_4_ = auVar40._12_4_ * fVar194;
                        auVar17 = vfmsub213ps_fma(auVar18,auVar42,auVar135);
                        auVar55 = vandps_avx(local_1938,auVar135);
                        auVar170 = vandps_avx(local_1938,auVar121);
                        auVar55 = vcmpps_avx(auVar55,auVar170,1);
                        auVar184 = vblendvps_avx(auVar184,auVar17,auVar55);
                        auVar17 = vfmsub213ps_fma(auVar40,auVar41,auVar71);
                        auVar18 = vfmsub213ps_fma(auVar39,auVar42,auVar52);
                        auVar55 = vandps_avx(local_1938,auVar71);
                        auVar170 = vandps_avx(local_1938,auVar52);
                        auVar55 = vcmpps_avx(auVar55,auVar170,1);
                        auVar170 = vblendvps_avx(auVar18,auVar17,auVar55);
                        local_1b28 = auVar19._0_4_;
                        fStack_1b24 = auVar19._4_4_;
                        fStack_1b20 = auVar19._8_4_;
                        auVar53._0_4_ = auVar170._0_4_ * local_1b28;
                        auVar53._4_4_ = auVar170._4_4_ * fStack_1b24;
                        auVar53._8_4_ = auVar170._8_4_ * fStack_1b20;
                        auVar53._12_4_ = auVar170._12_4_ * fVar169;
                        auVar55 = vfmadd213ps_fma(auVar56,auVar184,auVar53);
                        auVar55 = vfmadd213ps_fma(auVar131,auVar171,auVar55);
                        auVar54._0_4_ = auVar55._0_4_ + auVar55._0_4_;
                        auVar54._4_4_ = auVar55._4_4_ + auVar55._4_4_;
                        auVar54._8_4_ = auVar55._8_4_ + auVar55._8_4_;
                        auVar54._12_4_ = auVar55._12_4_ + auVar55._12_4_;
                        auVar72._0_4_ = auVar170._0_4_ * fVar8;
                        auVar72._4_4_ = auVar170._4_4_ * fVar9;
                        auVar72._8_4_ = auVar170._8_4_ * fVar10;
                        auVar72._12_4_ = auVar170._12_4_ * fVar11;
                        auVar55 = vfmadd213ps_fma(auVar147,auVar184,auVar72);
                        auVar56 = vfmadd213ps_fma(auVar146,auVar171,auVar55);
                        auVar55 = vrcpps_avx(auVar54);
                        auVar173._8_4_ = 0x3f800000;
                        auVar173._0_8_ = 0x3f8000003f800000;
                        auVar173._12_4_ = 0x3f800000;
                        auVar131 = vfnmadd213ps_fma(auVar55,auVar54,auVar173);
                        auVar55 = vfmadd132ps_fma(auVar131,auVar55,auVar55);
                        auVar73._0_4_ = auVar55._0_4_ * (auVar56._0_4_ + auVar56._0_4_);
                        auVar73._4_4_ = auVar55._4_4_ * (auVar56._4_4_ + auVar56._4_4_);
                        auVar73._8_4_ = auVar55._8_4_ * (auVar56._8_4_ + auVar56._8_4_);
                        auVar73._12_4_ = auVar55._12_4_ * (auVar56._12_4_ + auVar56._12_4_);
                        auVar55 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar73,2);
                        auVar56 = vcmpps_avx(auVar73,*(undefined1 (*) [16])(ray + 0x80),2);
                        auVar55 = vandps_avx(auVar56,auVar55);
                        uVar36 = CONCAT44(auVar54._4_4_,auVar54._0_4_);
                        auVar163._0_8_ = uVar36 ^ 0x8000000080000000;
                        auVar163._8_4_ = -auVar54._8_4_;
                        auVar163._12_4_ = -auVar54._12_4_;
                        auVar56 = vcmpps_avx(auVar163,auVar54,4);
                        auVar55 = vandps_avx(auVar56,auVar55);
                        auVar55 = vpslld_avx(auVar55,0x1f);
                        auVar56 = vpsrad_avx(auVar55,0x1f);
                        auVar55 = auVar80 & auVar56;
                        auVar80 = vandps_avx(auVar56,auVar80);
                        if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar55[0xf] < '\0') {
                          auVar115 = auVar150;
                          local_17b8 = auVar170;
                          local_17a8 = auVar184;
                          local_1798 = auVar171;
                          local_1788 = auVar73;
                          local_1778 = auVar150;
                          _local_1768 = auVar45;
                          _local_1758 = auVar44;
                        }
                      }
                      auVar187 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                    CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                      auVar189 = ZEXT1664(CONCAT412(0x3f800003,
                                                    CONCAT48(0x3f800003,0x3f8000033f800003)));
                      auVar55 = vpcmpeqd_avx(auVar115,auVar115);
                      auVar117 = ZEXT1664(auVar55);
                      uVar26 = *(undefined4 *)(local_1ad0 + lVar34);
                      auVar136._4_4_ = uVar26;
                      auVar136._0_4_ = uVar26;
                      auVar136._8_4_ = uVar26;
                      auVar136._12_4_ = uVar26;
                      uVar26 = *(undefined4 *)(local_1ac8 + lVar34);
                      auVar191._4_4_ = uVar26;
                      auVar191._0_4_ = uVar26;
                      auVar191._8_4_ = uVar26;
                      auVar191._12_4_ = uVar26;
                      uVar26 = *(undefined4 *)(local_1ac0 + lVar34);
                      auVar164._4_4_ = uVar26;
                      auVar164._0_4_ = uVar26;
                      auVar164._8_4_ = uVar26;
                      auVar164._12_4_ = uVar26;
                      uVar4 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                      pGVar6 = (context->scene->geometries).items[uVar4].ptr;
                      uVar25 = pGVar6->mask;
                      auVar74._4_4_ = uVar25;
                      auVar74._0_4_ = uVar25;
                      auVar74._8_4_ = uVar25;
                      auVar74._12_4_ = uVar25;
                      auVar55 = vpand_avx(auVar74,*(undefined1 (*) [16])(ray + 0x90));
                      auVar55 = vpcmpeqd_avx(auVar55,_DAT_01f45a50);
                      auVar115 = auVar80 & ~auVar55;
                      if ((((auVar115 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar115 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar115 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar115[0xf] < '\0') {
                        uVar26 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                        auVar80 = vandnps_avx(auVar55,auVar80);
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar55 = vandps_avx(local_1938,local_1778);
                          auVar115 = vrcpps_avx(local_1778);
                          auVar142._8_4_ = 0x3f800000;
                          auVar142._0_8_ = 0x3f8000003f800000;
                          auVar142._12_4_ = 0x3f800000;
                          auVar56 = vfnmadd213ps_fma(auVar115,local_1778,auVar142);
                          auVar115 = vfmadd132ps_fma(auVar56,auVar115,auVar115);
                          auVar81._8_4_ = 0x219392ef;
                          auVar81._0_8_ = 0x219392ef219392ef;
                          auVar81._12_4_ = 0x219392ef;
                          auVar55 = vcmpps_avx(auVar55,auVar81,5);
                          auVar55 = vandps_avx(auVar55,auVar115);
                          auVar61._0_4_ = auVar55._0_4_ * (float)local_1758._0_4_;
                          auVar61._4_4_ = auVar55._4_4_ * (float)local_1758._4_4_;
                          auVar61._8_4_ = auVar55._8_4_ * fStack_1750;
                          auVar61._12_4_ = auVar55._12_4_ * fStack_174c;
                          auVar56 = vminps_avx(auVar61,auVar142);
                          auVar82._0_4_ = auVar55._0_4_ * (float)local_1768._0_4_;
                          auVar82._4_4_ = auVar55._4_4_ * (float)local_1768._4_4_;
                          auVar82._8_4_ = auVar55._8_4_ * fStack_1760;
                          auVar82._12_4_ = auVar55._12_4_ * fStack_175c;
                          auVar131 = vminps_avx(auVar82,auVar142);
                          uVar2 = *(undefined4 *)(local_1ae0 + lVar34 + -4);
                          auVar100._4_4_ = uVar2;
                          auVar100._0_4_ = uVar2;
                          auVar100._8_4_ = uVar2;
                          auVar100._12_4_ = uVar2;
                          auVar115 = vpsrld_avx(auVar100,0x10);
                          auVar147 = ZEXT816(0) << 0x40;
                          auVar55 = vpblendw_avx(auVar100,auVar147,0xaa);
                          auVar55 = vcvtdq2ps_avx(auVar55);
                          auVar115 = vcvtdq2ps_avx(auVar115);
                          uVar2 = *(undefined4 *)(local_1ad8 + lVar34);
                          auVar125._4_4_ = uVar2;
                          auVar125._0_4_ = uVar2;
                          auVar125._8_4_ = uVar2;
                          auVar125._12_4_ = uVar2;
                          auVar146 = vsubps_avx(auVar142,auVar56);
                          auVar146 = vsubps_avx(auVar146,auVar131);
                          auVar101._0_4_ = auVar146._0_4_ * auVar55._0_4_ * 0.00012207031;
                          auVar101._4_4_ = auVar146._4_4_ * auVar55._4_4_ * 0.00012207031;
                          auVar101._8_4_ = auVar146._8_4_ * auVar55._8_4_ * 0.00012207031;
                          auVar101._12_4_ = auVar146._12_4_ * auVar55._12_4_ * 0.00012207031;
                          auVar114._0_4_ = auVar146._0_4_ * auVar115._0_4_ * 0.00012207031;
                          auVar114._4_4_ = auVar146._4_4_ * auVar115._4_4_ * 0.00012207031;
                          auVar114._8_4_ = auVar146._8_4_ * auVar115._8_4_ * 0.00012207031;
                          auVar114._12_4_ = auVar146._12_4_ * auVar115._12_4_ * 0.00012207031;
                          auVar55 = vpblendw_avx(auVar125,auVar147,0xaa);
                          auVar55 = vcvtdq2ps_avx(auVar55);
                          auVar143._0_4_ = auVar55._0_4_ * 0.00012207031;
                          auVar143._4_4_ = auVar55._4_4_ * 0.00012207031;
                          auVar143._8_4_ = auVar55._8_4_ * 0.00012207031;
                          auVar143._12_4_ = auVar55._12_4_ * 0.00012207031;
                          auVar115 = vfmadd231ps_fma(auVar101,auVar131,auVar143);
                          auVar55 = vpsrld_avx(auVar125,0x10);
                          auVar55 = vcvtdq2ps_avx(auVar55);
                          auVar126._0_4_ = auVar55._0_4_ * 0.00012207031;
                          auVar126._4_4_ = auVar55._4_4_ * 0.00012207031;
                          auVar126._8_4_ = auVar55._8_4_ * 0.00012207031;
                          auVar126._12_4_ = auVar55._12_4_ * 0.00012207031;
                          auVar131 = vfmadd231ps_fma(auVar114,auVar131,auVar126);
                          uVar2 = *(undefined4 *)(local_1ae0 + lVar34);
                          auVar83._4_4_ = uVar2;
                          auVar83._0_4_ = uVar2;
                          auVar83._8_4_ = uVar2;
                          auVar83._12_4_ = uVar2;
                          auVar55 = vpblendw_avx(auVar83,auVar147,0xaa);
                          auVar55 = vcvtdq2ps_avx(auVar55);
                          auVar127._0_4_ = auVar55._0_4_ * 0.00012207031;
                          auVar127._4_4_ = auVar55._4_4_ * 0.00012207031;
                          auVar127._8_4_ = auVar55._8_4_ * 0.00012207031;
                          auVar127._12_4_ = auVar55._12_4_ * 0.00012207031;
                          local_1978 = vfmadd231ps_fma(auVar115,auVar56,auVar127);
                          auVar55 = vpsrld_avx(auVar83,0x10);
                          auVar55 = vcvtdq2ps_avx(auVar55);
                          auVar84._0_4_ = auVar55._0_4_ * 0.00012207031;
                          auVar84._4_4_ = auVar55._4_4_ * 0.00012207031;
                          auVar84._8_4_ = auVar55._8_4_ * 0.00012207031;
                          auVar84._12_4_ = auVar55._12_4_ * 0.00012207031;
                          auVar56 = vfmadd231ps_fma(auVar131,auVar56,auVar84);
                          local_19c8._0_8_ = local_1798._0_8_;
                          local_19c8._8_8_ = local_1798._8_8_;
                          local_19c8._16_8_ = local_17a8._0_8_;
                          local_19c8._24_8_ = local_17a8._8_8_;
                          local_19c8._32_8_ = local_17b8._0_8_;
                          local_19c8._40_8_ = local_17b8._8_8_;
                          local_1998 = local_1788._0_8_;
                          uStack_1990 = local_1788._8_8_;
                          args.valid = (int *)&Ng;
                          args.geometryUserPtr = &t;
                          args.context = (RTCRayQueryContext *)&v;
                          args.ray = (RTCRayN *)&u;
                          local_1988 = auVar56;
                          std::
                          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                          ::
                          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                               *)&local_19c8.field_0);
                          local_1968._4_4_ = uVar4;
                          local_1968._0_4_ = uVar4;
                          local_1968._8_4_ = uVar4;
                          local_1968._12_4_ = uVar4;
                          local_19c8._0_8_ = Ng.field_0._0_8_;
                          local_19c8._8_8_ = Ng.field_0._8_8_;
                          local_19c8._16_8_ = Ng.field_0._16_8_;
                          local_19c8._24_8_ = Ng.field_0._24_8_;
                          local_19c8._32_8_ = Ng.field_0._32_8_;
                          local_19c8._40_8_ = Ng.field_0._40_8_;
                          local_1998 = u.field_0._0_8_;
                          uStack_1990 = u.field_0._8_8_;
                          local_1978._4_4_ = uVar26;
                          local_1978._0_4_ = uVar26;
                          local_1978._8_4_ = uVar26;
                          local_1978._12_4_ = uVar26;
                          vpcmpeqd_avx2(ZEXT1632(local_1968),ZEXT1632(local_1968));
                          uStack_1954 = context->user->instID[0];
                          local_1958 = uStack_1954;
                          uStack_1950 = uStack_1954;
                          uStack_194c = uStack_1954;
                          uStack_1948 = context->user->instPrimID[0];
                          uStack_1944 = uStack_1948;
                          uStack_1940 = uStack_1948;
                          uStack_193c = uStack_1948;
                          auVar55 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar115 = vblendvps_avx(auVar55,(undefined1  [16])t.field_0,auVar80);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar115;
                          args.valid = (int *)local_1af8;
                          args.geometryUserPtr = pGVar6->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_19c8;
                          args.N = 4;
                          args.ray = (RTCRayN *)ray;
                          local_1af8 = auVar80;
                          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar6->occlusionFilterN)(&args);
                          }
                          if (local_1af8 == (undefined1  [16])0x0) {
                            auVar80 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                            auVar115 = vpcmpeqd_avx(auVar56,auVar56);
                            auVar117 = ZEXT1664(auVar115);
                            auVar80 = auVar80 ^ auVar115;
                            auVar187 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                            auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                          CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                            auVar189 = ZEXT1664(CONCAT412(0x3f800003,
                                                          CONCAT48(0x3f800003,0x3f8000033f800003)));
                          }
                          else {
                            p_Var7 = context->args->filter;
                            auVar80 = vpcmpeqd_avx(auVar56,auVar56);
                            auVar117 = ZEXT1664(auVar80);
                            if (p_Var7 == (RTCFilterFunctionN)0x0) {
                              auVar187 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar189 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                            }
                            else {
                              auVar187 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar189 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var7)(&args);
                                auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                                auVar117 = ZEXT1664(auVar80);
                                auVar189 = ZEXT1664(CONCAT412(0x3f800003,
                                                              CONCAT48(0x3f800003,0x3f8000033f800003
                                                                      )));
                                auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                              CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa
                                                                      )));
                                auVar187 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                              }
                            }
                            auVar115 = vpcmpeqd_avx(local_1af8,_DAT_01f45a50);
                            auVar80 = auVar115 ^ auVar117._0_16_;
                            auVar104._8_4_ = 0xff800000;
                            auVar104._0_8_ = 0xff800000ff800000;
                            auVar104._12_4_ = 0xff800000;
                            auVar115 = vblendvps_avx(auVar104,*(undefined1 (*) [16])
                                                               (args.ray + 0x80),auVar115);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar115;
                          }
                          auVar115 = vpslld_avx(auVar80,0x1f);
                          auVar80 = vpsrad_avx(auVar115,0x1f);
                          auVar55 = vblendvps_avx(auVar55,*(undefined1 (*) [16])local_1ae8,auVar115)
                          ;
                          *(undefined1 (*) [16])local_1ae8 = auVar55;
                        }
                        auVar66 = vpandn_avx(auVar80,auVar66);
                      }
                      auVar90 = ZEXT1664(auVar66);
                      if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar66[0xf]) break;
                      auVar80 = *(undefined1 (*) [16])ray;
                      auVar55 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar115 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar131 = vsubps_avx(auVar176,auVar80);
                      auVar146 = vsubps_avx(auVar108,auVar55);
                      auVar56 = vsubps_avx(auVar133,auVar115);
                      auVar147 = vsubps_avx(auVar47,auVar80);
                      auVar170 = vsubps_avx(auVar68,auVar55);
                      auVar171 = vsubps_avx(auVar118,auVar115);
                      auVar184 = vsubps_avx(auVar136,auVar80);
                      auVar17 = vsubps_avx(auVar191,auVar55);
                      auVar115 = vsubps_avx(auVar164,auVar115);
                      auVar18 = vsubps_avx(auVar184,auVar131);
                      auVar39 = vsubps_avx(auVar17,auVar146);
                      auVar40 = vsubps_avx(auVar115,auVar56);
                      auVar111._0_4_ = auVar184._0_4_ + auVar131._0_4_;
                      auVar111._4_4_ = auVar184._4_4_ + auVar131._4_4_;
                      auVar111._8_4_ = auVar184._8_4_ + auVar131._8_4_;
                      auVar111._12_4_ = auVar184._12_4_ + auVar131._12_4_;
                      auVar151._0_4_ = auVar146._0_4_ + auVar17._0_4_;
                      auVar151._4_4_ = auVar146._4_4_ + auVar17._4_4_;
                      auVar151._8_4_ = auVar146._8_4_ + auVar17._8_4_;
                      auVar151._12_4_ = auVar146._12_4_ + auVar17._12_4_;
                      fVar190 = auVar56._0_4_;
                      auVar165._0_4_ = fVar190 + auVar115._0_4_;
                      fVar192 = auVar56._4_4_;
                      auVar165._4_4_ = fVar192 + auVar115._4_4_;
                      fVar193 = auVar56._8_4_;
                      auVar165._8_4_ = fVar193 + auVar115._8_4_;
                      fVar194 = auVar56._12_4_;
                      auVar165._12_4_ = fVar194 + auVar115._12_4_;
                      auVar183._0_4_ = auVar40._0_4_ * auVar151._0_4_;
                      auVar183._4_4_ = auVar40._4_4_ * auVar151._4_4_;
                      auVar183._8_4_ = auVar40._8_4_ * auVar151._8_4_;
                      auVar183._12_4_ = auVar40._12_4_ * auVar151._12_4_;
                      auVar42 = vfmsub231ps_fma(auVar183,auVar39,auVar165);
                      auVar178._0_4_ = auVar165._0_4_ * auVar18._0_4_;
                      auVar178._4_4_ = auVar165._4_4_ * auVar18._4_4_;
                      auVar178._8_4_ = auVar165._8_4_ * auVar18._8_4_;
                      auVar178._12_4_ = auVar165._12_4_ * auVar18._12_4_;
                      auVar55 = vfmsub231ps_fma(auVar178,auVar40,auVar111);
                      auVar112._0_4_ = auVar111._0_4_ * auVar39._0_4_;
                      auVar112._4_4_ = auVar111._4_4_ * auVar39._4_4_;
                      auVar112._8_4_ = auVar111._8_4_ * auVar39._8_4_;
                      auVar112._12_4_ = auVar111._12_4_ * auVar39._12_4_;
                      auVar41 = vfmsub231ps_fma(auVar112,auVar18,auVar151);
                      auVar80 = *(undefined1 (*) [16])(ray + 0x60);
                      fVar159 = auVar80._0_4_;
                      auVar113._0_4_ = fVar159 * auVar41._0_4_;
                      fVar167 = auVar80._4_4_;
                      auVar113._4_4_ = fVar167 * auVar41._4_4_;
                      fVar168 = auVar80._8_4_;
                      auVar113._8_4_ = fVar168 * auVar41._8_4_;
                      fVar169 = auVar80._12_4_;
                      auVar113._12_4_ = fVar169 * auVar41._12_4_;
                      auVar80 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar41 = vfmadd231ps_fma(auVar113,auVar80,auVar55);
                      auVar55 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar45 = vfmadd231ps_fma(auVar41,auVar55,auVar42);
                      auVar41 = vsubps_avx(auVar146,auVar170);
                      auVar42 = vsubps_avx(auVar56,auVar171);
                      auVar152._0_4_ = auVar146._0_4_ + auVar170._0_4_;
                      auVar152._4_4_ = auVar146._4_4_ + auVar170._4_4_;
                      auVar152._8_4_ = auVar146._8_4_ + auVar170._8_4_;
                      auVar152._12_4_ = auVar146._12_4_ + auVar170._12_4_;
                      auVar195._0_4_ = fVar190 + auVar171._0_4_;
                      auVar195._4_4_ = fVar192 + auVar171._4_4_;
                      auVar195._8_4_ = fVar193 + auVar171._8_4_;
                      auVar195._12_4_ = fVar194 + auVar171._12_4_;
                      fVar175 = auVar42._0_4_;
                      auVar137._0_4_ = fVar175 * auVar152._0_4_;
                      fVar180 = auVar42._4_4_;
                      auVar137._4_4_ = fVar180 * auVar152._4_4_;
                      fVar181 = auVar42._8_4_;
                      auVar137._8_4_ = fVar181 * auVar152._8_4_;
                      fVar182 = auVar42._12_4_;
                      auVar137._12_4_ = fVar182 * auVar152._12_4_;
                      auVar44 = vfmsub231ps_fma(auVar137,auVar41,auVar195);
                      auVar43 = vsubps_avx(auVar131,auVar147);
                      fVar8 = auVar43._0_4_;
                      auVar196._0_4_ = auVar195._0_4_ * fVar8;
                      fVar10 = auVar43._4_4_;
                      auVar196._4_4_ = auVar195._4_4_ * fVar10;
                      fVar13 = auVar43._8_4_;
                      auVar196._8_4_ = auVar195._8_4_ * fVar13;
                      fVar15 = auVar43._12_4_;
                      auVar196._12_4_ = auVar195._12_4_ * fVar15;
                      auVar157._0_4_ = auVar147._0_4_ + auVar131._0_4_;
                      auVar157._4_4_ = auVar147._4_4_ + auVar131._4_4_;
                      auVar157._8_4_ = auVar147._8_4_ + auVar131._8_4_;
                      auVar157._12_4_ = auVar147._12_4_ + auVar131._12_4_;
                      auVar56 = vfmsub231ps_fma(auVar196,auVar42,auVar157);
                      fVar9 = auVar41._0_4_;
                      auVar158._0_4_ = auVar157._0_4_ * fVar9;
                      fVar11 = auVar41._4_4_;
                      auVar158._4_4_ = auVar157._4_4_ * fVar11;
                      fVar14 = auVar41._8_4_;
                      auVar158._8_4_ = auVar157._8_4_ * fVar14;
                      fVar16 = auVar41._12_4_;
                      auVar158._12_4_ = auVar157._12_4_ * fVar16;
                      auVar64 = vfmsub231ps_fma(auVar158,auVar43,auVar152);
                      auVar153._0_4_ = fVar159 * auVar64._0_4_;
                      auVar153._4_4_ = fVar167 * auVar64._4_4_;
                      auVar153._8_4_ = fVar168 * auVar64._8_4_;
                      auVar153._12_4_ = fVar169 * auVar64._12_4_;
                      auVar56 = vfmadd231ps_fma(auVar153,auVar80,auVar56);
                      auVar64 = vfmadd231ps_fma(auVar56,auVar55,auVar44);
                      auVar44 = vsubps_avx(auVar147,auVar184);
                      auVar75._0_4_ = auVar147._0_4_ + auVar184._0_4_;
                      auVar75._4_4_ = auVar147._4_4_ + auVar184._4_4_;
                      auVar75._8_4_ = auVar147._8_4_ + auVar184._8_4_;
                      auVar75._12_4_ = auVar147._12_4_ + auVar184._12_4_;
                      auVar147 = vsubps_avx(auVar170,auVar17);
                      auVar57._0_4_ = auVar170._0_4_ + auVar17._0_4_;
                      auVar57._4_4_ = auVar170._4_4_ + auVar17._4_4_;
                      auVar57._8_4_ = auVar170._8_4_ + auVar17._8_4_;
                      auVar57._12_4_ = auVar170._12_4_ + auVar17._12_4_;
                      auVar170 = vsubps_avx(auVar171,auVar115);
                      auVar96._0_4_ = auVar171._0_4_ + auVar115._0_4_;
                      auVar96._4_4_ = auVar171._4_4_ + auVar115._4_4_;
                      auVar96._8_4_ = auVar171._8_4_ + auVar115._8_4_;
                      auVar96._12_4_ = auVar171._12_4_ + auVar115._12_4_;
                      auVar122._0_4_ = auVar170._0_4_ * auVar57._0_4_;
                      auVar122._4_4_ = auVar170._4_4_ * auVar57._4_4_;
                      auVar122._8_4_ = auVar170._8_4_ * auVar57._8_4_;
                      auVar122._12_4_ = auVar170._12_4_ * auVar57._12_4_;
                      auVar56 = vfmsub231ps_fma(auVar122,auVar147,auVar96);
                      auVar97._0_4_ = auVar44._0_4_ * auVar96._0_4_;
                      auVar97._4_4_ = auVar44._4_4_ * auVar96._4_4_;
                      auVar97._8_4_ = auVar44._8_4_ * auVar96._8_4_;
                      auVar97._12_4_ = auVar44._12_4_ * auVar96._12_4_;
                      auVar115 = vfmsub231ps_fma(auVar97,auVar170,auVar75);
                      auVar76._0_4_ = auVar147._0_4_ * auVar75._0_4_;
                      auVar76._4_4_ = auVar147._4_4_ * auVar75._4_4_;
                      auVar76._8_4_ = auVar147._8_4_ * auVar75._8_4_;
                      auVar76._12_4_ = auVar147._12_4_ * auVar75._12_4_;
                      auVar171 = vfmsub231ps_fma(auVar76,auVar44,auVar57);
                      auVar58._0_4_ = fVar159 * auVar171._0_4_;
                      auVar58._4_4_ = fVar167 * auVar171._4_4_;
                      auVar58._8_4_ = fVar168 * auVar171._8_4_;
                      auVar58._12_4_ = fVar169 * auVar171._12_4_;
                      auVar115 = vfmadd231ps_fma(auVar58,auVar80,auVar115);
                      auVar171 = vfmadd231ps_fma(auVar115,auVar55,auVar56);
                      auVar138._0_4_ = auVar171._0_4_ + auVar45._0_4_ + auVar64._0_4_;
                      auVar138._4_4_ = auVar171._4_4_ + auVar45._4_4_ + auVar64._4_4_;
                      auVar138._8_4_ = auVar171._8_4_ + auVar45._8_4_ + auVar64._8_4_;
                      auVar138._12_4_ = auVar171._12_4_ + auVar45._12_4_ + auVar64._12_4_;
                      auVar115 = vandps_avx(auVar138,local_1938);
                      auVar77._0_4_ = auVar115._0_4_ * 1.1920929e-07;
                      auVar77._4_4_ = auVar115._4_4_ * 1.1920929e-07;
                      auVar77._8_4_ = auVar115._8_4_ * 1.1920929e-07;
                      auVar77._12_4_ = auVar115._12_4_ * 1.1920929e-07;
                      auVar115 = vminps_avx(auVar45,auVar64);
                      auVar115 = vminps_avx(auVar115,auVar171);
                      uVar36 = CONCAT44(auVar77._4_4_,auVar77._0_4_);
                      auVar123._0_8_ = uVar36 ^ 0x8000000080000000;
                      auVar123._8_4_ = -auVar77._8_4_;
                      auVar123._12_4_ = -auVar77._12_4_;
                      auVar115 = vcmpps_avx(auVar115,auVar123,5);
                      auVar56 = vmaxps_avx(auVar45,auVar64);
                      auVar56 = vmaxps_avx(auVar56,auVar171);
                      auVar56 = vcmpps_avx(auVar56,auVar77,2);
                      auVar115 = vorps_avx(auVar115,auVar56);
                      auVar56 = auVar66 & auVar115;
                      auVar115 = vandps_avx(auVar115,auVar66);
                      auVar171 = auVar45;
                      if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar56[0xf] < '\0') {
                        auVar59._0_4_ = fVar9 * auVar40._0_4_;
                        auVar59._4_4_ = fVar11 * auVar40._4_4_;
                        auVar59._8_4_ = fVar14 * auVar40._8_4_;
                        auVar59._12_4_ = fVar16 * auVar40._12_4_;
                        local_1a68._4_4_ = fVar10 * auVar39._4_4_;
                        local_1a68._0_4_ = fVar8 * auVar39._0_4_;
                        fStack_1a60 = fVar13 * auVar39._8_4_;
                        fStack_1a5c = fVar15 * auVar39._12_4_;
                        auVar184 = vfmsub213ps_fma(auVar39,auVar42,auVar59);
                        auVar98._0_4_ = auVar147._0_4_ * fVar175;
                        auVar98._4_4_ = auVar147._4_4_ * fVar180;
                        auVar98._8_4_ = auVar147._8_4_ * fVar181;
                        auVar98._12_4_ = auVar147._12_4_ * fVar182;
                        auVar124._0_4_ = fVar8 * auVar170._0_4_;
                        auVar124._4_4_ = fVar10 * auVar170._4_4_;
                        auVar124._8_4_ = fVar13 * auVar170._8_4_;
                        auVar124._12_4_ = fVar15 * auVar170._12_4_;
                        auVar17 = vfmsub213ps_fma(auVar170,auVar41,auVar98);
                        auVar56 = vandps_avx(local_1938,auVar59);
                        auVar170 = vandps_avx(local_1938,auVar98);
                        auVar56 = vcmpps_avx(auVar56,auVar170,1);
                        auVar184 = vblendvps_avx(auVar17,auVar184,auVar56);
                        auVar139._0_4_ = auVar44._0_4_ * fVar9;
                        auVar139._4_4_ = auVar44._4_4_ * fVar11;
                        auVar139._8_4_ = auVar44._8_4_ * fVar14;
                        auVar139._12_4_ = auVar44._12_4_ * fVar16;
                        auVar17 = vfmsub213ps_fma(auVar44,auVar42,auVar124);
                        auVar99._0_4_ = fVar175 * auVar18._0_4_;
                        auVar99._4_4_ = fVar180 * auVar18._4_4_;
                        auVar99._8_4_ = fVar181 * auVar18._8_4_;
                        auVar99._12_4_ = fVar182 * auVar18._12_4_;
                        auVar39 = vfmsub213ps_fma(auVar40,auVar43,auVar99);
                        auVar56 = vandps_avx(local_1938,auVar99);
                        auVar170 = vandps_avx(local_1938,auVar124);
                        auVar56 = vcmpps_avx(auVar56,auVar170,1);
                        auVar170 = vblendvps_avx(auVar17,auVar39,auVar56);
                        auVar17 = vfmsub213ps_fma(auVar18,auVar41,_local_1a68);
                        auVar18 = vfmsub213ps_fma(auVar147,auVar43,auVar139);
                        auVar56 = vandps_avx(local_1938,_local_1a68);
                        auVar147 = vandps_avx(local_1938,auVar139);
                        auVar56 = vcmpps_avx(auVar56,auVar147,1);
                        auVar56 = vblendvps_avx(auVar18,auVar17,auVar56);
                        auVar78._0_4_ = auVar56._0_4_ * fVar159;
                        auVar78._4_4_ = auVar56._4_4_ * fVar167;
                        auVar78._8_4_ = auVar56._8_4_ * fVar168;
                        auVar78._12_4_ = auVar56._12_4_ * fVar169;
                        auVar80 = vfmadd213ps_fma(auVar80,auVar170,auVar78);
                        auVar80 = vfmadd213ps_fma(auVar55,auVar184,auVar80);
                        auVar79._0_4_ = auVar80._0_4_ + auVar80._0_4_;
                        auVar79._4_4_ = auVar80._4_4_ + auVar80._4_4_;
                        auVar79._8_4_ = auVar80._8_4_ + auVar80._8_4_;
                        auVar79._12_4_ = auVar80._12_4_ + auVar80._12_4_;
                        auVar140._0_4_ = auVar56._0_4_ * fVar190;
                        auVar140._4_4_ = auVar56._4_4_ * fVar192;
                        auVar140._8_4_ = auVar56._8_4_ * fVar193;
                        auVar140._12_4_ = auVar56._12_4_ * fVar194;
                        auVar80 = vfmadd213ps_fma(auVar146,auVar170,auVar140);
                        auVar55 = vfmadd213ps_fma(auVar131,auVar184,auVar80);
                        auVar80 = vrcpps_avx(auVar79);
                        auVar174._8_4_ = 0x3f800000;
                        auVar174._0_8_ = 0x3f8000003f800000;
                        auVar174._12_4_ = 0x3f800000;
                        auVar131 = vfnmadd213ps_fma(auVar80,auVar79,auVar174);
                        auVar80 = vfmadd132ps_fma(auVar131,auVar80,auVar80);
                        auVar141._0_4_ = auVar80._0_4_ * (auVar55._0_4_ + auVar55._0_4_);
                        auVar141._4_4_ = auVar80._4_4_ * (auVar55._4_4_ + auVar55._4_4_);
                        auVar141._8_4_ = auVar80._8_4_ * (auVar55._8_4_ + auVar55._8_4_);
                        auVar141._12_4_ = auVar80._12_4_ * (auVar55._12_4_ + auVar55._12_4_);
                        auVar80 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar141,2);
                        auVar55 = vcmpps_avx(auVar141,*(undefined1 (*) [16])(ray + 0x80),2);
                        auVar80 = vandps_avx(auVar55,auVar80);
                        uVar36 = CONCAT44(auVar79._4_4_,auVar79._0_4_);
                        auVar166._0_8_ = uVar36 ^ 0x8000000080000000;
                        auVar166._8_4_ = -auVar79._8_4_;
                        auVar166._12_4_ = -auVar79._12_4_;
                        auVar55 = vcmpps_avx(auVar166,auVar79,4);
                        auVar80 = vandps_avx(auVar55,auVar80);
                        auVar80 = vpslld_avx(auVar80,0x1f);
                        auVar55 = vpsrad_avx(auVar80,0x1f);
                        auVar80 = auVar115 & auVar55;
                        auVar115 = vandps_avx(auVar55,auVar115);
                        if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar80[0xf] < '\0') {
                          auVar171 = auVar138;
                          local_1828 = auVar56;
                          local_1818 = auVar170;
                          local_1808 = auVar184;
                          local_17f8 = auVar141;
                          local_17e8 = auVar138;
                          _local_17d8 = auVar64;
                          _local_17c8 = auVar45;
                        }
                      }
                      auVar187 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                    CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                      auVar189 = ZEXT1664(CONCAT412(0x3f800003,
                                                    CONCAT48(0x3f800003,0x3f8000033f800003)));
                      auVar80 = vpcmpeqd_avx(auVar171,auVar171);
                      auVar117 = ZEXT1664(auVar80);
                      uVar4 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                      pGVar6 = (context->scene->geometries).items[uVar4].ptr;
                      uVar25 = pGVar6->mask;
                      auVar60._4_4_ = uVar25;
                      auVar60._0_4_ = uVar25;
                      auVar60._8_4_ = uVar25;
                      auVar60._12_4_ = uVar25;
                      auVar80 = vpand_avx(auVar60,*(undefined1 (*) [16])(ray + 0x90));
                      auVar80 = vpcmpeqd_avx(auVar80,_DAT_01f45a50);
                      auVar55 = auVar115 & ~auVar80;
                      if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar55[0xf] < '\0') {
                        uVar26 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                        auVar80 = vandnps_avx(auVar80,auVar115);
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar55 = vandps_avx(local_1938,local_17e8);
                          auVar115 = vrcpps_avx(local_17e8);
                          auVar144._8_4_ = 0x3f800000;
                          auVar144._0_8_ = 0x3f8000003f800000;
                          auVar144._12_4_ = 0x3f800000;
                          auVar56 = vfnmadd213ps_fma(auVar115,local_17e8,auVar144);
                          auVar115 = vfmadd132ps_fma(auVar56,auVar115,auVar115);
                          auVar85._8_4_ = 0x219392ef;
                          auVar85._0_8_ = 0x219392ef219392ef;
                          auVar85._12_4_ = 0x219392ef;
                          auVar55 = vcmpps_avx(auVar55,auVar85,5);
                          auVar55 = vandps_avx(auVar55,auVar115);
                          auVar62._0_4_ = auVar55._0_4_ * (float)local_17c8._0_4_;
                          auVar62._4_4_ = auVar55._4_4_ * (float)local_17c8._4_4_;
                          auVar62._8_4_ = auVar55._8_4_ * fStack_17c0;
                          auVar62._12_4_ = auVar55._12_4_ * fStack_17bc;
                          auVar56 = vminps_avx(auVar62,auVar144);
                          auVar86._0_4_ = auVar55._0_4_ * (float)local_17d8._0_4_;
                          auVar86._4_4_ = auVar55._4_4_ * (float)local_17d8._4_4_;
                          auVar86._8_4_ = auVar55._8_4_ * fStack_17d0;
                          auVar86._12_4_ = auVar55._12_4_ * fStack_17cc;
                          auVar131 = vminps_avx(auVar86,auVar144);
                          uVar2 = *(undefined4 *)(local_1ad8 + lVar34);
                          auVar102._4_4_ = uVar2;
                          auVar102._0_4_ = uVar2;
                          auVar102._8_4_ = uVar2;
                          auVar102._12_4_ = uVar2;
                          auVar115 = vpsrld_avx(auVar102,0x10);
                          auVar147 = ZEXT816(0) << 0x20;
                          auVar55 = vpblendw_avx(auVar102,auVar147,0xaa);
                          auVar55 = vcvtdq2ps_avx(auVar55);
                          auVar115 = vcvtdq2ps_avx(auVar115);
                          uVar2 = *(undefined4 *)(local_1ad8 + lVar34 + 4);
                          auVar128._4_4_ = uVar2;
                          auVar128._0_4_ = uVar2;
                          auVar128._8_4_ = uVar2;
                          auVar128._12_4_ = uVar2;
                          auVar146 = vsubps_avx(auVar144,auVar56);
                          auVar146 = vsubps_avx(auVar146,auVar131);
                          auVar103._0_4_ = auVar146._0_4_ * auVar55._0_4_ * 0.00012207031;
                          auVar103._4_4_ = auVar146._4_4_ * auVar55._4_4_ * 0.00012207031;
                          auVar103._8_4_ = auVar146._8_4_ * auVar55._8_4_ * 0.00012207031;
                          auVar103._12_4_ = auVar146._12_4_ * auVar55._12_4_ * 0.00012207031;
                          auVar116._0_4_ = auVar146._0_4_ * auVar115._0_4_ * 0.00012207031;
                          auVar116._4_4_ = auVar146._4_4_ * auVar115._4_4_ * 0.00012207031;
                          auVar116._8_4_ = auVar146._8_4_ * auVar115._8_4_ * 0.00012207031;
                          auVar116._12_4_ = auVar146._12_4_ * auVar115._12_4_ * 0.00012207031;
                          auVar55 = vpblendw_avx(auVar128,auVar147,0xaa);
                          auVar55 = vcvtdq2ps_avx(auVar55);
                          auVar145._0_4_ = auVar55._0_4_ * 0.00012207031;
                          auVar145._4_4_ = auVar55._4_4_ * 0.00012207031;
                          auVar145._8_4_ = auVar55._8_4_ * 0.00012207031;
                          auVar145._12_4_ = auVar55._12_4_ * 0.00012207031;
                          auVar115 = vfmadd231ps_fma(auVar103,auVar131,auVar145);
                          auVar55 = vpsrld_avx(auVar128,0x10);
                          auVar55 = vcvtdq2ps_avx(auVar55);
                          auVar129._0_4_ = auVar55._0_4_ * 0.00012207031;
                          auVar129._4_4_ = auVar55._4_4_ * 0.00012207031;
                          auVar129._8_4_ = auVar55._8_4_ * 0.00012207031;
                          auVar129._12_4_ = auVar55._12_4_ * 0.00012207031;
                          auVar131 = vfmadd231ps_fma(auVar116,auVar131,auVar129);
                          uVar2 = *(undefined4 *)(local_1ae0 + lVar34);
                          auVar87._4_4_ = uVar2;
                          auVar87._0_4_ = uVar2;
                          auVar87._8_4_ = uVar2;
                          auVar87._12_4_ = uVar2;
                          auVar55 = vpblendw_avx(auVar87,auVar147,0xaa);
                          auVar55 = vcvtdq2ps_avx(auVar55);
                          auVar130._0_4_ = auVar55._0_4_ * 0.00012207031;
                          auVar130._4_4_ = auVar55._4_4_ * 0.00012207031;
                          auVar130._8_4_ = auVar55._8_4_ * 0.00012207031;
                          auVar130._12_4_ = auVar55._12_4_ * 0.00012207031;
                          local_1978 = vfmadd231ps_fma(auVar115,auVar56,auVar130);
                          auVar55 = vpsrld_avx(auVar87,0x10);
                          auVar55 = vcvtdq2ps_avx(auVar55);
                          auVar88._0_4_ = auVar55._0_4_ * 0.00012207031;
                          auVar88._4_4_ = auVar55._4_4_ * 0.00012207031;
                          auVar88._8_4_ = auVar55._8_4_ * 0.00012207031;
                          auVar88._12_4_ = auVar55._12_4_ * 0.00012207031;
                          auVar56 = vfmadd231ps_fma(auVar131,auVar56,auVar88);
                          local_19c8._0_8_ = local_1808._0_8_;
                          local_19c8._8_8_ = local_1808._8_8_;
                          local_19c8._16_8_ = local_1818._0_8_;
                          local_19c8._24_8_ = local_1818._8_8_;
                          local_19c8._32_8_ = local_1828._0_8_;
                          local_19c8._40_8_ = local_1828._8_8_;
                          local_1998 = local_17f8._0_8_;
                          uStack_1990 = local_17f8._8_8_;
                          args.valid = (int *)&Ng;
                          args.geometryUserPtr = &t;
                          args.context = (RTCRayQueryContext *)&v;
                          args.ray = (RTCRayN *)&u;
                          local_1988 = auVar56;
                          std::
                          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                          ::
                          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                               *)&local_19c8.field_0);
                          local_1968._4_4_ = uVar4;
                          local_1968._0_4_ = uVar4;
                          local_1968._8_4_ = uVar4;
                          local_1968._12_4_ = uVar4;
                          local_19c8._0_8_ = Ng.field_0._0_8_;
                          local_19c8._8_8_ = Ng.field_0._8_8_;
                          local_19c8._16_8_ = Ng.field_0._16_8_;
                          local_19c8._24_8_ = Ng.field_0._24_8_;
                          local_19c8._32_8_ = Ng.field_0._32_8_;
                          local_19c8._40_8_ = Ng.field_0._40_8_;
                          local_1998 = u.field_0._0_8_;
                          uStack_1990 = u.field_0._8_8_;
                          local_1978._4_4_ = uVar26;
                          local_1978._0_4_ = uVar26;
                          local_1978._8_4_ = uVar26;
                          local_1978._12_4_ = uVar26;
                          vpcmpeqd_avx2(ZEXT1632(local_1968),ZEXT1632(local_1968));
                          uStack_1954 = context->user->instID[0];
                          local_1958 = uStack_1954;
                          uStack_1950 = uStack_1954;
                          uStack_194c = uStack_1954;
                          uStack_1948 = context->user->instPrimID[0];
                          uStack_1944 = uStack_1948;
                          uStack_1940 = uStack_1948;
                          uStack_193c = uStack_1948;
                          auVar55 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar115 = vblendvps_avx(auVar55,(undefined1  [16])t.field_0,auVar80);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar115;
                          args.valid = (int *)local_1af8;
                          args.geometryUserPtr = pGVar6->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_19c8;
                          args.N = 4;
                          args.ray = (RTCRayN *)ray;
                          local_1af8 = auVar80;
                          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar6->occlusionFilterN)(&args);
                          }
                          if (local_1af8 == (undefined1  [16])0x0) {
                            auVar80 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                            auVar115 = vpcmpeqd_avx(auVar56,auVar56);
                            auVar117 = ZEXT1664(auVar115);
                            auVar80 = auVar80 ^ auVar115;
                            auVar187 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                            auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                          CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                            auVar189 = ZEXT1664(CONCAT412(0x3f800003,
                                                          CONCAT48(0x3f800003,0x3f8000033f800003)));
                          }
                          else {
                            p_Var7 = context->args->filter;
                            auVar80 = vpcmpeqd_avx(auVar56,auVar56);
                            auVar117 = ZEXT1664(auVar80);
                            if (p_Var7 == (RTCFilterFunctionN)0x0) {
                              auVar187 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar189 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                            }
                            else {
                              auVar187 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar189 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var7)(&args);
                                auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                                auVar117 = ZEXT1664(auVar80);
                                auVar189 = ZEXT1664(CONCAT412(0x3f800003,
                                                              CONCAT48(0x3f800003,0x3f8000033f800003
                                                                      )));
                                auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                              CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa
                                                                      )));
                                auVar187 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                              }
                            }
                            auVar115 = vpcmpeqd_avx(local_1af8,_DAT_01f45a50);
                            auVar80 = auVar115 ^ auVar117._0_16_;
                            auVar105._8_4_ = 0xff800000;
                            auVar105._0_8_ = 0xff800000ff800000;
                            auVar105._12_4_ = 0xff800000;
                            auVar115 = vblendvps_avx(auVar105,*(undefined1 (*) [16])
                                                               (args.ray + 0x80),auVar115);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar115;
                          }
                          auVar115 = vpslld_avx(auVar80,0x1f);
                          auVar80 = vpsrad_avx(auVar115,0x1f);
                          auVar55 = vblendvps_avx(auVar55,*(undefined1 (*) [16])local_1ae8,auVar115)
                          ;
                          *(undefined1 (*) [16])local_1ae8 = auVar55;
                        }
                        auVar66 = vpandn_avx(auVar80,auVar66);
                      }
                      auVar90 = ZEXT1664(auVar66);
                      lVar34 = lVar34 + 4;
                    } while ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                              (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             auVar66[0xf] < '\0');
                    local_1ad8 = local_1ad8 + lVar1;
                    local_1ac0 = local_1ac0 + lVar1;
                    local_1ac8 = local_1ac8 + lVar1;
                    local_1ad0 = local_1ad0 + lVar1;
                    local_1ae0 = local_1ae0 + lVar1;
                    local_1a90 = local_1a90 + lVar1;
                    local_1a98 = local_1a98 + lVar1;
                    lVar29 = lVar29 + lVar1;
                  }
                  auVar63 = auVar90._0_16_ ^ auVar117._0_16_;
                  sVar28 = 0;
                }
                else {
                  pre.super_Precalculations.grid = (GridSOA *)(root.ptr & 0xfffffffffffffff0);
                  sVar28 = *(size_t *)
                            (pre.super_Precalculations.grid +
                            (ulong)*(uint *)(pre.super_Precalculations.grid + 0x2c) + 0x30);
                  auVar63._8_8_ = uVar21;
                  auVar63._0_8_ = uVar20;
                  auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                  auVar117 = ZEXT1664(auVar80);
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vpor_avx(auVar63,(undefined1  [16])terminated.field_0);
                auVar80 = auVar117._0_16_ & ~(undefined1  [16])terminated.field_0;
                if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar80 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar80 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar80[0xf]) goto LAB_0155908e;
                auVar90 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
                auVar106._8_4_ = 0xff800000;
                auVar106._0_8_ = 0xff800000ff800000;
                auVar106._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar106,
                                   (undefined1  [16])terminated.field_0);
                if (sVar28 != 0) {
                  pNVar33->ptr = sVar28;
                  pNVar33 = pNVar33 + 1;
                  paVar37->i[0] = -0x800000;
                  paVar37->i[1] = -0x800000;
                  paVar37->i[2] = -0x800000;
                  paVar37->i[3] = -0x800000;
                  paVar37 = paVar37 + 1;
                }
              }
              goto LAB_01557836;
            }
            auVar80 = auVar187._0_16_;
            for (lVar29 = 0;
                (auVar197 = ZEXT1664(auVar80), lVar29 != 4 &&
                (sVar5 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar29 * 8), sVar5 != 8));
                lVar29 = lVar29 + 1) {
              uVar26 = *(undefined4 *)(root.ptr + 0x20 + lVar29 * 4);
              auVar39._4_4_ = uVar26;
              auVar39._0_4_ = uVar26;
              auVar39._8_4_ = uVar26;
              auVar39._12_4_ = uVar26;
              auVar56._8_8_ = tray.org.field_0._8_8_;
              auVar56._0_8_ = tray.org.field_0._0_8_;
              auVar17._8_8_ = tray.org.field_0._24_8_;
              auVar17._0_8_ = tray.org.field_0._16_8_;
              auVar18._8_8_ = tray.org.field_0._40_8_;
              auVar18._0_8_ = tray.org.field_0._32_8_;
              auVar55 = vsubps_avx(auVar39,auVar56);
              auVar132._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar55._0_4_;
              auVar132._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar55._4_4_;
              auVar132._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar55._8_4_;
              auVar132._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar55._12_4_;
              uVar26 = *(undefined4 *)(root.ptr + 0x40 + lVar29 * 4);
              auVar40._4_4_ = uVar26;
              auVar40._0_4_ = uVar26;
              auVar40._8_4_ = uVar26;
              auVar40._12_4_ = uVar26;
              auVar55 = vsubps_avx(auVar40,auVar17);
              auVar154._0_4_ = tray.rdir.field_0._16_4_ * auVar55._0_4_;
              auVar154._4_4_ = tray.rdir.field_0._20_4_ * auVar55._4_4_;
              auVar154._8_4_ = tray.rdir.field_0._24_4_ * auVar55._8_4_;
              auVar154._12_4_ = tray.rdir.field_0._28_4_ * auVar55._12_4_;
              uVar26 = *(undefined4 *)(root.ptr + 0x60 + lVar29 * 4);
              auVar41._4_4_ = uVar26;
              auVar41._0_4_ = uVar26;
              auVar41._8_4_ = uVar26;
              auVar41._12_4_ = uVar26;
              auVar55 = vsubps_avx(auVar41,auVar18);
              auVar172._0_4_ = tray.rdir.field_0._32_4_ * auVar55._0_4_;
              auVar172._4_4_ = tray.rdir.field_0._36_4_ * auVar55._4_4_;
              auVar172._8_4_ = tray.rdir.field_0._40_4_ * auVar55._8_4_;
              auVar172._12_4_ = tray.rdir.field_0._44_4_ * auVar55._12_4_;
              uVar26 = *(undefined4 *)(root.ptr + 0x30 + lVar29 * 4);
              auVar42._4_4_ = uVar26;
              auVar42._0_4_ = uVar26;
              auVar42._8_4_ = uVar26;
              auVar42._12_4_ = uVar26;
              auVar55 = vsubps_avx(auVar42,auVar56);
              auVar64._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar55._0_4_;
              auVar64._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar55._4_4_;
              auVar64._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar55._8_4_;
              auVar64._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar55._12_4_;
              uVar26 = *(undefined4 *)(root.ptr + 0x50 + lVar29 * 4);
              auVar43._4_4_ = uVar26;
              auVar43._0_4_ = uVar26;
              auVar43._8_4_ = uVar26;
              auVar43._12_4_ = uVar26;
              auVar55 = vsubps_avx(auVar43,auVar17);
              auVar91._0_4_ = tray.rdir.field_0._16_4_ * auVar55._0_4_;
              auVar91._4_4_ = tray.rdir.field_0._20_4_ * auVar55._4_4_;
              auVar91._8_4_ = tray.rdir.field_0._24_4_ * auVar55._8_4_;
              auVar91._12_4_ = tray.rdir.field_0._28_4_ * auVar55._12_4_;
              uVar26 = *(undefined4 *)(root.ptr + 0x70 + lVar29 * 4);
              auVar44._4_4_ = uVar26;
              auVar44._0_4_ = uVar26;
              auVar44._8_4_ = uVar26;
              auVar44._12_4_ = uVar26;
              auVar55 = vsubps_avx(auVar44,auVar18);
              auVar107._0_4_ = tray.rdir.field_0._32_4_ * auVar55._0_4_;
              auVar107._4_4_ = tray.rdir.field_0._36_4_ * auVar55._4_4_;
              auVar107._8_4_ = tray.rdir.field_0._40_4_ * auVar55._8_4_;
              auVar107._12_4_ = tray.rdir.field_0._44_4_ * auVar55._12_4_;
              auVar117 = ZEXT1664(auVar107);
              auVar55 = vminps_avx(auVar132,auVar64);
              auVar115 = vminps_avx(auVar154,auVar91);
              auVar55 = vmaxps_avx(auVar55,auVar115);
              auVar115 = vminps_avx(auVar172,auVar107);
              auVar55 = vmaxps_avx(auVar55,auVar115);
              auVar45._0_4_ = auVar179._0_4_ * auVar55._0_4_;
              auVar45._4_4_ = auVar179._4_4_ * auVar55._4_4_;
              auVar45._8_4_ = auVar179._8_4_ * auVar55._8_4_;
              auVar45._12_4_ = auVar179._12_4_ * auVar55._12_4_;
              auVar55 = vmaxps_avx(auVar132,auVar64);
              auVar115 = vmaxps_avx(auVar154,auVar91);
              auVar115 = vminps_avx(auVar55,auVar115);
              auVar55 = vmaxps_avx(auVar172,auVar107);
              auVar55 = vminps_avx(auVar115,auVar55);
              auVar65._0_4_ = auVar189._0_4_ * auVar55._0_4_;
              auVar65._4_4_ = auVar189._4_4_ * auVar55._4_4_;
              auVar65._8_4_ = auVar189._8_4_ * auVar55._8_4_;
              auVar65._12_4_ = auVar189._12_4_ * auVar55._12_4_;
              auVar55 = vmaxps_avx(auVar45,(undefined1  [16])tray.tnear.field_0);
              auVar115 = vminps_avx(auVar65,(undefined1  [16])tray.tfar.field_0);
              auVar115 = vcmpps_avx(auVar55,auVar115,2);
              auVar90 = ZEXT1664(auVar115);
              sVar23 = sVar28;
              auVar55 = auVar80;
              if (((((auVar115 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar115 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar115 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar115[0xf] < '\0') &&
                 (auVar55 = vblendvps_avx(auVar187._0_16_,auVar45,auVar115), sVar23 = sVar5,
                 sVar28 != 8)) {
                pNVar33->ptr = sVar28;
                pNVar33 = pNVar33 + 1;
                *(undefined1 (*) [16])paVar37->v = auVar80;
                paVar37 = paVar37 + 1;
              }
              auVar80 = auVar55;
              sVar28 = sVar23;
            }
            if (sVar28 == 8) goto LAB_015579fa;
            auVar55 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar80,6);
            uVar26 = vmovmskps_avx(auVar55);
            root.ptr = sVar28;
          } while ((byte)uVar35 < (byte)POPCOUNT(uVar26));
          pNVar33->ptr = sVar28;
          pNVar33 = pNVar33 + 1;
          *(undefined1 (*) [16])paVar37->v = auVar80;
          paVar37 = paVar37 + 1;
        }
        else {
          auVar80 = vpcmpeqd_avx(auVar90._0_16_,auVar90._0_16_);
          auVar90 = ZEXT1664(auVar80);
          while (auVar80 = auVar90._0_16_, uVar36 != 0) {
            sVar28 = 0;
            for (uVar30 = uVar36; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
              sVar28 = sVar28 + 1;
            }
            uVar36 = uVar36 - 1 & uVar36;
            auVar117 = ZEXT1664(auVar117._0_16_);
            bVar24 = occluded1(This,bvh,root,sVar28,&pre,ray,&tray,context);
            auVar80 = vpcmpeqd_avx(auVar80,auVar80);
            auVar90 = ZEXT1664(auVar80);
            if (bVar24) {
              terminated.field_0.i[sVar28] = -1;
            }
          }
          auVar80 = auVar80 & ~(undefined1  [16])terminated.field_0;
          iVar27 = 3;
          auVar187 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar179 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar189 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar197 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar80[0xf] < '\0') {
            auVar90 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar80._8_4_ = 0xff800000;
            auVar80._0_8_ = 0xff800000ff800000;
            auVar80._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar80,
                               (undefined1  [16])terminated.field_0);
            iVar27 = 2;
          }
          if (uVar35 < uVar25) goto LAB_01557876;
        }
LAB_015579fa:
      } while ((iVar27 == 4) || (iVar27 == 2));
LAB_0155908e:
      auVar12 = vandps_avx(auVar12,(undefined1  [16])terminated.field_0);
      auVar89._8_4_ = 0xff800000;
      auVar89._0_8_ = 0xff800000ff800000;
      auVar89._12_4_ = 0xff800000;
      auVar12 = vmaskmovps_avx(auVar12,auVar89);
      *(undefined1 (*) [16])local_1ae8 = auVar12;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }